

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O2

TypeTable * MyGame::Example::AnyAmbiguousAliasesTypeTable(void)

{
  return &AnyAmbiguousAliasesTypeTable::tt;
}

Assistant:

inline const ::flatbuffers::TypeTable *AnyAmbiguousAliasesTypeTable() {
  static const ::flatbuffers::TypeCode type_codes[] = {
    { ::flatbuffers::ET_SEQUENCE, 0, -1 },
    { ::flatbuffers::ET_SEQUENCE, 0, 0 },
    { ::flatbuffers::ET_SEQUENCE, 0, 0 },
    { ::flatbuffers::ET_SEQUENCE, 0, 0 }
  };
  static const ::flatbuffers::TypeFunction type_refs[] = {
    MyGame::Example::MonsterTypeTable
  };
  static const char * const names[] = {
    "NONE",
    "M1",
    "M2",
    "M3"
  };
  static const ::flatbuffers::TypeTable tt = {
    ::flatbuffers::ST_UNION, 4, type_codes, type_refs, nullptr, nullptr, names
  };
  return &tt;
}